

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::EliminateDeadMembersPass::MarkPointeeTypeAsFullUsed
          (EliminateDeadMembersPass *this,uint32_t ptr_type_id)

{
  Op OVar1;
  uint32_t type_id;
  DefUseManager *this_00;
  Instruction *this_01;
  Instruction *ptr_type_inst;
  uint32_t ptr_type_id_local;
  EliminateDeadMembersPass *this_local;
  
  this_00 = Pass::get_def_use_mgr((Pass *)this);
  this_01 = analysis::DefUseManager::GetDef(this_00,ptr_type_id);
  OVar1 = opt::Instruction::opcode(this_01);
  if (OVar1 == OpTypePointer) {
    type_id = opt::Instruction::GetSingleWordInOperand(this_01,1);
    MarkTypeAsFullyUsed(this,type_id);
    return;
  }
  __assert_fail("ptr_type_inst->opcode() == spv::Op::OpTypePointer",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                ,0xa9,
                "void spvtools::opt::EliminateDeadMembersPass::MarkPointeeTypeAsFullUsed(uint32_t)")
  ;
}

Assistant:

void EliminateDeadMembersPass::MarkPointeeTypeAsFullUsed(uint32_t ptr_type_id) {
  Instruction* ptr_type_inst = get_def_use_mgr()->GetDef(ptr_type_id);
  assert(ptr_type_inst->opcode() == spv::Op::OpTypePointer);
  MarkTypeAsFullyUsed(ptr_type_inst->GetSingleWordInOperand(1));
}